

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

int __thiscall
flow_cutter::
SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
::init(SimpleCutter<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>_>
       *this,EVP_PKEY_CTX *ctx)

{
  GraphSearchAlgorithm GVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  runtime_error *this_00;
  DistanceType dist_type;
  PierceNodeScore *in_stack_00001250;
  Config in_stack_00001260;
  undefined1 local_c8 [19];
  undefined1 should_skip_non_maximum_sides;
  DistanceType in_stack_ffffffffffffff4c;
  PierceNodeScore *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  TemporaryData *in_stack_ffffffffffffff60;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  *in_stack_ffffffffffffff68;
  MultiCutter *in_stack_ffffffffffffff70;
  vector<flow_cutter::SourceTargetPair,_std::allocator<flow_cutter::SourceTargetPair>_>
  *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  
  should_skip_non_maximum_sides = (undefined1)((uint)stack0xffffffffffffff48 >> 0x18);
  GVar1 = (this->config).graph_search_algorithm;
  if (GVar1 == pseudo_depth_first_search) {
    memcpy(&stack0xffffffffffffff90,&this->config,0x24);
    PierceNodeScore::PierceNodeScore(in_stack_00001250,in_stack_00001260);
    MultiCutter::
    init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::PseudoDepthFirstSearch,flow_cutter::PierceNodeScore>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               (PseudoDepthFirstSearch *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
               (bool)should_skip_non_maximum_sides);
    iVar2 = extraout_EAX;
  }
  else if (GVar1 == breadth_first_search) {
    memcpy(local_c8,&this->config,0x24);
    PierceNodeScore::PierceNodeScore(in_stack_00001250,in_stack_00001260);
    MultiCutter::
    init<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               (BreadthFirstSearch *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
               (bool)should_skip_non_maximum_sides);
    iVar2 = extraout_EAX_00;
  }
  else {
    iVar2 = GVar1 - depth_first_search;
    if (iVar2 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"depth first search is not yet implemented");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return iVar2;
}

Assistant:

void init(const std::vector<SourceTargetPair>& p, int random_seed)
    {
        DistanceType dist_type;

        if (config.pierce_rating == Config::PierceRating::min_source_hop_dist || config.pierce_rating == Config::PierceRating::max_target_hop_dist || config.pierce_rating == Config::PierceRating::max_target_minus_source_hop_dist)
            dist_type = DistanceType::hop_distance;
        else
            dist_type = DistanceType::no_distance;

        switch (config.graph_search_algorithm) {
        case Config::GraphSearchAlgorithm::pseudo_depth_first_search:
            cutter.init(graph, tmp, PseudoDepthFirstSearch(), PierceNodeScore(config),
                dist_type, p, config.max_cut_size, random_seed,
                config.skip_non_maximum_sides == Config::SkipNonMaximumSides::skip);
            break;

        case Config::GraphSearchAlgorithm::breadth_first_search:
            cutter.init(graph, tmp, BreadthFirstSearch(), PierceNodeScore(config),
                dist_type, p, config.max_cut_size, random_seed,
                config.skip_non_maximum_sides == Config::SkipNonMaximumSides::skip);
            break;

        case Config::GraphSearchAlgorithm::depth_first_search:
            throw std::runtime_error("depth first search is not yet implemented");
        default:
            assert(false);
        }
    }